

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterable_feature.cc
# Opt level: O0

ostream * range_to_stream<ezy::strong_type<ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,std::vector<int,std::allocator<int>>const>>>>>>,void,ezy::features::iterable>>
                    (ostream *ostr,
                    strong_type<ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>,_void,_ezy::features::iterable>
                    *range)

{
  bool bVar1;
  int *element;
  ostream *poVar2;
  int *e;
  const_iterator __end0;
  const_iterator __begin0;
  strong_type<ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>,_void,_ezy::features::iterable>
  *__range1;
  strong_type<ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>,_void,_ezy::features::iterable>
  *range_local;
  ostream *ostr_local;
  
  std::operator<<(ostr,"[");
  ezy::features::has_iterator::
  impl<ezy::strong_type<ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>,_void,_ezy::features::iterable>_>
  ::begin((const_iterator *)&__end0.n,
          (impl<ezy::strong_type<ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>,_void,_ezy::features::iterable>_>
           *)range);
  ezy::features::has_iterator::
  impl<ezy::strong_type<ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>,_void,_ezy::features::iterable>_>
  ::end((const_iterator *)&e,
        (impl<ezy::strong_type<ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>,_void,_ezy::features::iterable>_>
         *)range);
  while( true ) {
    bVar1 = ezy::detail::
            take_iterator<const_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
            ::operator!=((take_iterator<const_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                          *)&__end0.n,
                         (take_iterator<const_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                          *)&e);
    if (!bVar1) break;
    element = ezy::detail::
              take_iterator<const_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
              ::operator*((take_iterator<const_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                           *)&__end0.n);
    poVar2 = element_to_stream<int>(ostr,element);
    std::operator<<(poVar2,", ");
    ezy::detail::
    take_iterator<const_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
    ::operator++((take_iterator<const_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                  *)&__end0.n);
  }
  poVar2 = std::operator<<(ostr,"]");
  return poVar2;
}

Assistant:

std::ostream& range_to_stream(std::ostream& ostr, const RangeType& range)
{
  ostr << "[";
  for (const auto& e : range)
    element_to_stream(ostr, e) << ", ";

  return ostr << "]";
}